

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_util.cpp
# Opt level: O1

EnumStringLiteral * duckdb::GetLogLevelValues(void)

{
  return GetLogLevelValues::values;
}

Assistant:

const StringUtil::EnumStringLiteral *GetLogLevelValues() {
	static constexpr StringUtil::EnumStringLiteral values[] {
		{ static_cast<uint32_t>(LogLevel::LOG_TRACE), "TRACE" },
		{ static_cast<uint32_t>(LogLevel::LOG_DEBUG), "DEBUG" },
		{ static_cast<uint32_t>(LogLevel::LOG_INFO), "INFO" },
		{ static_cast<uint32_t>(LogLevel::LOG_WARN), "WARN" },
		{ static_cast<uint32_t>(LogLevel::LOG_ERROR), "ERROR" },
		{ static_cast<uint32_t>(LogLevel::LOG_FATAL), "FATAL" }
	};
	return values;
}